

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON.c
# Opt level: O0

char * cJSON_strdup(char *str)

{
  size_t sVar1;
  char *copy;
  size_t len;
  char *str_local;
  
  sVar1 = strlen(str);
  str_local = (char *)(*cJSON_malloc)(sVar1 + 1);
  if (str_local == (char *)0x0) {
    str_local = (char *)0x0;
  }
  else {
    memcpy(str_local,str,sVar1 + 1);
  }
  return str_local;
}

Assistant:

static char* cJSON_strdup(const char* str)
{
      size_t len;
      char* copy;

      len = strlen(str) + 1;
      if (!(copy = (char*)cJSON_malloc(len))) return 0;
      memcpy(copy,str,len);
      return copy;
}